

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::wif_unsigned_long_trace::write
          (wif_unsigned_long_trace *this,int __fd,void *__buf,size_t __n)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  unsigned_long bit_mask;
  int bitindex;
  char buf [1000];
  undefined1 local_411;
  ulong local_408;
  int local_3fc;
  undefined1 local_3f8 [1000];
  FILE *local_10;
  wif_unsigned_long_trace *local_8;
  
  local_10 = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if ((*this->object & this->mask) == *this->object) {
    local_408 = 1L << ((char)(this->super_wif_trace).bit_width - 1U & 0x3f);
    for (local_3fc = 0; local_3fc < (this->super_wif_trace).bit_width; local_3fc = local_3fc + 1) {
      local_411 = 0x31;
      if ((*this->object & local_408) == 0) {
        local_411 = 0x30;
      }
      local_3f8[local_3fc] = local_411;
      local_408 = local_408 >> 1;
    }
  }
  else {
    for (local_3fc = 0; local_3fc < (this->super_wif_trace).bit_width; local_3fc = local_3fc + 1) {
      local_3f8[local_3fc] = 0x30;
    }
  }
  local_3f8[local_3fc] = 0;
  __stream = local_10;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"assign %s \"%s\" ;\n",uVar1,local_3f8);
  this->old_value = *this->object;
  return (ssize_t)this;
}

Assistant:

void wif_unsigned_long_trace::write(FILE* f)
{
    char buf[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex]='0';
        }
    }
    else{
        unsigned long bit_mask = 1ul << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    buf[bitindex] = '\0';
    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), buf);
    old_value = object;
}